

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O2

HPDF_UINT MeasureText(HPDF_Font font,HPDF_BYTE *text,HPDF_UINT len,HPDF_REAL width,
                     HPDF_REAL font_size,HPDF_REAL char_space,HPDF_REAL word_space,
                     HPDF_BOOL wordwrap,HPDF_REAL *real_width)

{
  byte bVar1;
  HPDF_BYTE HVar2;
  void *pvVar3;
  HPDF_Encoder encoder;
  long lVar4;
  HPDF_UINT16 HVar5;
  ushort uVar6;
  HPDF_UNICODE unicode;
  HPDF_ByteType HVar7;
  ulong uVar8;
  short sVar9;
  uint uVar10;
  HPDF_UINT HVar11;
  ulong uVar12;
  float fVar13;
  HPDF_ParseText_Rec parse_state;
  ulong local_80;
  HPDF_ParseText_Rec local_48;
  
  pvVar3 = font->attr;
  encoder = *(HPDF_Encoder *)((long)pvVar3 + 0x20);
  lVar4 = *(long *)((long)pvVar3 + 0x18);
  if (*(int *)(lVar4 + 0x98) == 2) {
    sVar9 = *(short *)(*(long *)(lVar4 + 0xf8) + 0xc);
  }
  else {
    sVar9 = (short)(int)(*(float *)(lVar4 + 0xc4) - *(float *)(lVar4 + 0xcc));
  }
  HPDF_Encoder_SetParseText(encoder,&local_48,text,len);
  fVar13 = 0.0;
  uVar12 = 0;
  local_80 = 0;
  do {
    HVar11 = (HPDF_UINT)uVar12;
    if (len == HVar11) {
      if (real_width != (HPDF_REAL *)0x0) {
        *real_width = fVar13;
      }
      return len;
    }
    bVar1 = text[uVar12];
    uVar10 = (uint)bVar1;
    HVar2 = text[uVar12 + 1];
    HVar7 = HPDF_Encoder_ByteType(encoder,&local_48);
    HVar5 = CONCAT11(bVar1,HVar2);
    if (HVar7 != HPDF_BYTE_TYPE_LEAD) {
      HVar5 = (ushort)bVar1;
    }
    uVar8 = (ulong)uVar10;
    if (wordwrap == 0) {
      if ((uVar10 < 0x21) && ((0x100003601U >> (uVar8 & 0x3f) & 1) != 0)) {
        local_80 = (ulong)(HVar11 + 1);
        if (real_width != (HPDF_REAL *)0x0) {
LAB_0011eb1c:
          *real_width = fVar13;
        }
      }
      else {
        if (HVar7 < HPDF_BYTE_TYPE_TRAIL) {
          local_80 = uVar12;
        }
        local_80 = local_80 & 0xffffffff;
        if (HVar7 < HPDF_BYTE_TYPE_TRAIL && real_width != (HPDF_REAL *)0x0) {
          local_80 = uVar12 & 0xffffffff;
          goto LAB_0011eb1c;
        }
      }
    }
    else if ((uVar10 < 0x21) && ((0x100003601U >> (uVar8 & 0x3f) & 1) != 0)) {
      if (real_width != (HPDF_REAL *)0x0) {
        local_80 = (ulong)(HVar11 + 1);
        goto LAB_0011eb1c;
      }
      local_80 = uVar12 + 1;
    }
    if ((uVar10 < 0x21) && ((0x100003601U >> (uVar8 & 0x3f) & 1) != 0)) {
      fVar13 = fVar13 + word_space;
    }
    if (HVar7 == HPDF_BYTE_TYPE_TRAIL) {
      uVar6 = 0;
    }
    else {
      uVar6 = -sVar9;
      if (*(int *)((long)pvVar3 + 4) == 0) {
        if (*(int *)(*(long *)((long)pvVar3 + 0x18) + 0x98) == 2) {
          HVar5 = HPDF_CMapEncoder_ToCID(encoder,HVar5);
          uVar6 = HPDF_CIDFontDef_GetCIDWidth(*(HPDF_FontDef *)((long)pvVar3 + 0x18),HVar5);
        }
        else {
          unicode = (*encoder->to_unicode_fn)(encoder,HVar5);
          uVar6 = HPDF_TTFontDef_GetCharWidth(*(HPDF_FontDef *)((long)pvVar3 + 0x18),unicode);
        }
      }
      if (HVar11 != 0) {
        fVar13 = fVar13 + char_space;
      }
    }
    fVar13 = ((float)uVar6 * font_size) / 1000.0 + fVar13;
    if (width < fVar13) {
      return (HPDF_UINT)local_80;
    }
    uVar12 = uVar12 + 1;
    if (bVar1 == 10) {
      return (HPDF_UINT)local_80;
    }
  } while( true );
}

Assistant:

static HPDF_UINT
MeasureText  (HPDF_Font          font,
              const HPDF_BYTE   *text,
              HPDF_UINT          len,
              HPDF_REAL          width,
              HPDF_REAL          font_size,
              HPDF_REAL          char_space,
              HPDF_REAL          word_space,
              HPDF_BOOL          wordwrap,
              HPDF_REAL         *real_width)
{
    HPDF_REAL w = 0;
    HPDF_UINT tmp_len = 0;
    HPDF_UINT i;
    HPDF_FontAttr attr = (HPDF_FontAttr)font->attr;
    //HPDF_ByteType last_btype = HPDF_BYTE_TYPE_TRAIL;
    HPDF_Encoder encoder = attr->encoder;
    HPDF_ParseText_Rec  parse_state;
    HPDF_INT dw2;

    HPDF_PTRACE ((" HPDF_Type0Font_MeasureText\n"));

    if (attr->fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        HPDF_CIDFontDefAttr cid_fontdef_attr =
                (HPDF_CIDFontDefAttr)attr->fontdef->attr;
        dw2 = cid_fontdef_attr->DW2[1];
    } else {
        dw2 = (HPDF_INT)(attr->fontdef->font_bbox.bottom -
                    attr->fontdef->font_bbox.top);
    }

    HPDF_Encoder_SetParseText (encoder, &parse_state, text, len);

    for (i = 0; i < len; i++) {
        HPDF_BYTE b = *text++;
        HPDF_BYTE b2 = *text;  /* next byte */
        HPDF_ByteType btype = HPDF_Encoder_ByteType (encoder, &parse_state);
        HPDF_UNICODE unicode;
        HPDF_UINT16 code = b;
        HPDF_UINT16 tmp_w = 0;

        if (btype == HPDF_BYTE_TYPE_LEAD) {
            code <<= 8;
            code = (HPDF_UINT16)(code + b2);
        }

        if (!wordwrap) {
            if (HPDF_IS_WHITE_SPACE(b)) {
                tmp_len = i + 1;
                if (real_width)
                    *real_width = w;
            } else if (btype == HPDF_BYTE_TYPE_SINGLE ||
                        btype == HPDF_BYTE_TYPE_LEAD) {
                tmp_len = i;
                if (real_width)
                    *real_width = w;
            }
        } else {
            if (HPDF_IS_WHITE_SPACE(b)) {
                tmp_len = i + 1;
                if (real_width)
                    *real_width = w;
            } /* else
			//Commenting this out fixes problem with HPDF_Text_Rect() splitting the words
            if (last_btype == HPDF_BYTE_TYPE_TRAIL ||
                    (btype == HPDF_BYTE_TYPE_LEAD &&
                    last_btype == HPDF_BYTE_TYPE_SINGLE)) {
                if (!HPDF_Encoder_CheckJWWLineHead(encoder, code)) {
                    tmp_len = i;
                    if (real_width)
                        *real_width = w;
                }
            }*/
        }

        if (HPDF_IS_WHITE_SPACE(b)) {
            w += word_space;
        }

        if (btype != HPDF_BYTE_TYPE_TRAIL) {
            if (attr->writing_mode == HPDF_WMODE_HORIZONTAL) {
                if (attr->fontdef->type == HPDF_FONTDEF_TYPE_CID) {
                    /* cid-based font */
                    HPDF_UINT16 cid = HPDF_CMapEncoder_ToCID (encoder, code);
                    tmp_w = HPDF_CIDFontDef_GetCIDWidth (attr->fontdef, cid);
                } else {
                    /* unicode-based font */
                    unicode = (encoder->to_unicode_fn)(encoder, code);
                    tmp_w = HPDF_TTFontDef_GetCharWidth (attr->fontdef,
                            unicode);
                }
            } else {
                tmp_w = (HPDF_UINT16)(-dw2);
            }

            if (i > 0)
                w += char_space;
        }

        w += (HPDF_REAL)((HPDF_DOUBLE)tmp_w * font_size / 1000);

        /* 2006.08.04 break when it encountered  line feed */
        if (w > width || b == 0x0A)
            return tmp_len;

        /*
        if (HPDF_IS_WHITE_SPACE(b))
            last_btype = HPDF_BYTE_TYPE_TRAIL;
        else
            last_btype = btype;
        */

    }

    /* all of text can be put in the specified width */
    if (real_width)
        *real_width = w;

    return len;
}